

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
adios2sys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,bool *variable,string *value)

{
  bool bVar1;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  
  bVar1 = std::operator==(in_RSI,in_RDX);
  if ((((((!bVar1) && (bVar1 = std::operator==(in_RSI,in_RDX), !bVar1)) &&
        (bVar1 = std::operator==(in_RSI,in_RDX), !bVar1)) &&
       ((bVar1 = std::operator==(in_RSI,in_RDX), !bVar1 &&
        (bVar1 = std::operator==(in_RSI,in_RDX), !bVar1)))) &&
      ((bVar1 = std::operator==(in_RSI,in_RDX), !bVar1 &&
       ((bVar1 = std::operator==(in_RSI,in_RDX), !bVar1 &&
        (bVar1 = std::operator==(in_RSI,in_RDX), !bVar1)))))) &&
     ((bVar1 = std::operator==(in_RSI,in_RDX), !bVar1 &&
      (bVar1 = std::operator==(in_RSI,in_RDX), !bVar1)))) {
    in_RSI->_M_dataplus = (_Alloc_hider)0x0;
    return;
  }
  in_RSI->_M_dataplus = (_Alloc_hider)0x1;
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(bool* variable,
                                            const std::string& value)
{
  if (value == "1" || value == "ON" || value == "on" || value == "On" ||
      value == "TRUE" || value == "true" || value == "True" ||
      value == "yes" || value == "Yes" || value == "YES") {
    *variable = true;
  } else {
    *variable = false;
  }
}